

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O2

void __thiscall QFbVtHandler::handleSignal(QFbVtHandler *this)

{
  int __fd;
  __pid_t __pid;
  ssize_t sVar1;
  int *piVar2;
  long in_FS_OFFSET;
  char sigNo;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QSocketNotifier::setEnabled(SUB81(*(undefined8 *)(this + 0x20),0));
  sigNo = -0x56;
  __fd = *(int *)(this + 0x1c);
  do {
    sVar1 = read(__fd,&sigNo,1);
    if (sVar1 != -1) {
      if (sVar1 != 1) break;
      if (sigNo != '\x12') {
        if (sigNo == '\x14') {
          aboutToSuspend(this);
          setKeyboardEnabled(this,true);
          setTTYCursor(true);
          __pid = getpid();
          kill(__pid,0x13);
          break;
        }
        if ((sigNo != '\x0f') && (sigNo != '\x02')) break;
        handleInt(this);
      }
      setTTYCursor(false);
      setKeyboardEnabled(this,false);
      resumed(this);
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  QSocketNotifier::setEnabled(SUB81(*(undefined8 *)(this + 0x20),0));
  return;
}

Assistant:

void QFbVtHandler::handleSignal()
{
#ifdef VTH_ENABLED
    m_signalNotifier->setEnabled(false);

    char sigNo;
    if (QT_READ(m_sigFd[1], &sigNo, sizeof(sigNo)) == sizeof(sigNo)) {
        switch (sigNo) {
        case SIGINT:
        case SIGTERM:
            handleInt();
            break;
        case SIGTSTP:
            emit aboutToSuspend();
            setKeyboardEnabled(true);
            setTTYCursor(true);
            ::kill(getpid(), SIGSTOP);
            break;
        case SIGCONT:
            setTTYCursor(false);
            setKeyboardEnabled(false);
            emit resumed();
            break;
        default:
            break;
        }
    }

    m_signalNotifier->setEnabled(true);
#endif
}